

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.hxx
# Opt level: O2

void __thiscall Time::~Time(Time *this)

{
  (this->super_Physical)._vptr_Physical = (_func_int **)&PTR__Time_00157730;
  std::_Vector_base<Estimator_*,_std::allocator<Estimator_*>_>::~_Vector_base
            (&(this->timeEstimators).super__Vector_base<Estimator_*,_std::allocator<Estimator_*>_>);
  std::_Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>::~_Vector_base
            (&(this->timeObjects).
              super__Vector_base<TimeDependent_*,_std::allocator<TimeDependent_*>_>);
  Physical::~Physical(&this->super_Physical);
  return;
}

Assistant:

virtual ~Time(){}